

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceDirectional::IfcLightSourceDirectional
          (IfcLightSourceDirectional *this)

{
  *(undefined ***)&this->field_0x98 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(char **)&this->field_0xa8 = "IfcLightSourceDirectional";
  IfcLightSource::IfcLightSource(&this->super_IfcLightSource,&PTR_construction_vtable_24__007bcdc0);
  *(undefined8 *)&(this->super_IfcLightSource).field_0x88 = 0;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x90 = 0;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7bcd08;
  *(undefined8 *)&this->field_0x98 = 0x7bcda8;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7bcd30;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7bcd58;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x80 = 0x7bcd80;
  return;
}

Assistant:

IfcLightSourceDirectional() : Object("IfcLightSourceDirectional") {}